

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTable.cpp
# Opt level: O0

void __thiscall SymTable::Print(SymTable *this)

{
  bool bVar1;
  reference ppVar2;
  ostream *poVar3;
  undefined1 local_98 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
  item;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>_>
  *__range1;
  SymTable *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>_>
           ::begin(&this->symtable);
  item.second.dValue =
       (double)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>_>
               ::end(&this->symtable);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&item.second.dValue);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
            *)local_98,ppVar2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&item.second.Name.field_2 + 8),"int");
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)(item.first.field_2._M_local_buf + 8)
                              );
      poVar3 = std::operator<<(poVar3,' ');
      poVar3 = std::operator<<(poVar3,(string *)(item.second.Name.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,' ');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,item.second.Type.field_2._8_4_);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)(item.first.field_2._M_local_buf + 8)
                              );
      poVar3 = std::operator<<(poVar3,' ');
      poVar3 = std::operator<<(poVar3,(string *)(item.second.Name.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,' ');
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)item.second._64_8_);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>
             *)local_98);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SymTable::Print() {
    for(auto item : symtable){
        if(item.second.Type=="int")
            std::cout<<item.second.Name<<' '<<item.second.Type<<' '<<item.second.iValue<<std::endl;
        else
            std::cout<<item.second.Name<<' '<<item.second.Type<<' '<<item.second.dValue<<std::endl;
    }
}